

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O1

StatelessGenerator<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>_> __thiscall
cppqc::arrayOf<ArbitraryTestsFixtures::UserDefinedType,2ul>
          (cppqc *this,StatelessGenerator<ArbitraryTestsFixtures::UserDefinedType> *g)

{
  __uniq_ptr_impl<cppqc::detail::StatelessGenConcept<ArbitraryTestsFixtures::UserDefinedType>,_std::default_delete<cppqc::detail::StatelessGenConcept<ArbitraryTestsFixtures::UserDefinedType>_>_>
  local_10;
  
  local_10._M_t.
  super__Tuple_impl<0UL,_cppqc::detail::StatelessGenConcept<ArbitraryTestsFixtures::UserDefinedType>_*,_std::default_delete<cppqc::detail::StatelessGenConcept<ArbitraryTestsFixtures::UserDefinedType>_>_>
  .
  super__Head_base<0UL,_cppqc::detail::StatelessGenConcept<ArbitraryTestsFixtures::UserDefinedType>_*,_false>
  ._M_head_impl =
       (tuple<cppqc::detail::StatelessGenConcept<ArbitraryTestsFixtures::UserDefinedType>_*,_std::default_delete<cppqc::detail::StatelessGenConcept<ArbitraryTestsFixtures::UserDefinedType>_>_>
        )(**(code **)((long)((g->m_gen)._M_t.
                             super___uniq_ptr_impl<cppqc::detail::StatelessGenConcept<ArbitraryTestsFixtures::UserDefinedType>,_std::default_delete<cppqc::detail::StatelessGenConcept<ArbitraryTestsFixtures::UserDefinedType>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cppqc::detail::StatelessGenConcept<ArbitraryTestsFixtures::UserDefinedType>_*,_std::default_delete<cppqc::detail::StatelessGenConcept<ArbitraryTestsFixtures::UserDefinedType>_>_>
                             .
                             super__Head_base<0UL,_cppqc::detail::StatelessGenConcept<ArbitraryTestsFixtures::UserDefinedType>_*,_false>
                            ._M_head_impl)->
                            super_GenConcept<ArbitraryTestsFixtures::UserDefinedType> + 0x20))();
  StatelessGenerator<std::array<ArbitraryTestsFixtures::UserDefinedType,2ul>>::
  StatelessGenerator<cppqc::detail::ArrayOfStatelessGenerator<ArbitraryTestsFixtures::UserDefinedType,2ul>>
            ((StatelessGenerator<std::array<ArbitraryTestsFixtures::UserDefinedType,2ul>> *)this,
             (ArrayOfStatelessGenerator<ArbitraryTestsFixtures::UserDefinedType,_2UL> *)&local_10);
  if ((_Tuple_impl<0UL,_cppqc::detail::StatelessGenConcept<ArbitraryTestsFixtures::UserDefinedType>_*,_std::default_delete<cppqc::detail::StatelessGenConcept<ArbitraryTestsFixtures::UserDefinedType>_>_>
       )local_10._M_t.
        super__Tuple_impl<0UL,_cppqc::detail::StatelessGenConcept<ArbitraryTestsFixtures::UserDefinedType>_*,_std::default_delete<cppqc::detail::StatelessGenConcept<ArbitraryTestsFixtures::UserDefinedType>_>_>
        .
        super__Head_base<0UL,_cppqc::detail::StatelessGenConcept<ArbitraryTestsFixtures::UserDefinedType>_*,_false>
        ._M_head_impl != (StatelessGenConcept<ArbitraryTestsFixtures::UserDefinedType> *)0x0) {
    (**(code **)(*(long *)local_10._M_t.
                          super__Tuple_impl<0UL,_cppqc::detail::StatelessGenConcept<ArbitraryTestsFixtures::UserDefinedType>_*,_std::default_delete<cppqc::detail::StatelessGenConcept<ArbitraryTestsFixtures::UserDefinedType>_>_>
                          .
                          super__Head_base<0UL,_cppqc::detail::StatelessGenConcept<ArbitraryTestsFixtures::UserDefinedType>_*,_false>
                          ._M_head_impl + 8))();
  }
  return (unique_ptr<cppqc::detail::StatelessGenConcept<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>_>,_std::default_delete<cppqc::detail::StatelessGenConcept<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>_>_>_>
          )(unique_ptr<cppqc::detail::StatelessGenConcept<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>_>,_std::default_delete<cppqc::detail::StatelessGenConcept<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>_>_>_>
            )this;
}

Assistant:

StatelessGenerator<std::array<T, N>> arrayOf(
    const StatelessGenerator<T>& g = Arbitrary<T>()) {
  return detail::ArrayOfStatelessGenerator<T, N>(g);
}